

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O3

uint32_t uloc_getLCID_63(char *localeID)

{
  uint32_t uVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  UErrorCode status;
  char tmpLocaleID [157];
  char collVal [96];
  char langID [157];
  UErrorCode local_1bc;
  char local_1b8 [160];
  char local_118 [96];
  char local_b8 [160];
  
  local_1bc = U_ZERO_ERROR;
  if (localeID == (char *)0x0) {
    return 0;
  }
  sVar3 = strlen(localeID);
  if (sVar3 < 2) {
    return 0;
  }
  uVar1 = uprv_convertToLCIDPlatform_63(localeID);
  if (uVar1 != 0) {
    return uVar1;
  }
  uloc_getLanguage_63(localeID,local_b8,0x9d,&local_1bc);
  if (U_ZERO_ERROR < local_1bc) {
    return 0;
  }
  pcVar4 = strchr(localeID,0x40);
  if (pcVar4 != (char *)0x0) {
    uVar2 = uloc_getKeywordValue_63(localeID,"collation",local_118,0x5f,&local_1bc);
    if (0 < (int)uVar2 && local_1bc < U_ILLEGAL_ARGUMENT_ERROR) {
      local_118[uVar2] = '\0';
      uVar2 = _canonicalize(localeID,local_1b8,0x9c,2,&local_1bc);
      if ((0 < (int)uVar2) && (local_1bc < U_ILLEGAL_ARGUMENT_ERROR)) {
        local_1b8[uVar2] = '\0';
        uVar2 = uloc_setKeywordValue_63("collation",local_118,local_1b8,0x9c - uVar2,&local_1bc);
        if (local_1bc < U_ILLEGAL_ARGUMENT_ERROR && 0 < (int)uVar2) {
          local_1b8[uVar2] = '\0';
          localeID = local_1b8;
          goto LAB_001ba97b;
        }
      }
    }
    local_1bc = U_ZERO_ERROR;
  }
LAB_001ba97b:
  uVar1 = uprv_convertToLCID_63(local_b8,localeID,&local_1bc);
  return uVar1;
}

Assistant:

U_CAPI uint32_t  U_EXPORT2
uloc_getLCID(const char* localeID)
{
    UErrorCode status = U_ZERO_ERROR;
    char       langID[ULOC_FULLNAME_CAPACITY];
    uint32_t   lcid = 0;

    /* Check for incomplete id. */
    if (!localeID || uprv_strlen(localeID) < 2) {
        return 0;
    }

    // Attempt platform lookup if available
    lcid = uprv_convertToLCIDPlatform(localeID);
    if (lcid > 0)
    {
        // Windows found an LCID, return that
        return lcid;
    }

    uloc_getLanguage(localeID, langID, sizeof(langID), &status);
    if (U_FAILURE(status)) {
        return 0;
    }

    if (uprv_strchr(localeID, '@')) {
        // uprv_convertToLCID does not support keywords other than collation.
        // Remove all keywords except collation.
        int32_t len;
        char collVal[ULOC_KEYWORDS_CAPACITY];
        char tmpLocaleID[ULOC_FULLNAME_CAPACITY];

        len = uloc_getKeywordValue(localeID, "collation", collVal,
            UPRV_LENGTHOF(collVal) - 1, &status);

        if (U_SUCCESS(status) && len > 0) {
            collVal[len] = 0;

            len = uloc_getBaseName(localeID, tmpLocaleID,
                UPRV_LENGTHOF(tmpLocaleID) - 1, &status);

            if (U_SUCCESS(status) && len > 0) {
                tmpLocaleID[len] = 0;

                len = uloc_setKeywordValue("collation", collVal, tmpLocaleID,
                    UPRV_LENGTHOF(tmpLocaleID) - len - 1, &status);

                if (U_SUCCESS(status) && len > 0) {
                    tmpLocaleID[len] = 0;
                    return uprv_convertToLCID(langID, tmpLocaleID, &status);
                }
            }
        }

        // fall through - all keywords are simply ignored
        status = U_ZERO_ERROR;
    }

    return uprv_convertToLCID(langID, localeID, &status);
}